

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void __thiscall
TPZReducedSpace::ComputeRequiredData
          (TPZReducedSpace *this,TPZMaterialDataT<double> *data,TPZVec<double> *qsi)

{
  TPZGeoEl *pTVar1;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  double dVar2;
  double *unaff_retaddr;
  int64_t in_stack_00000008;
  TPZManVector<double,_3> *in_stack_00000010;
  int dim;
  TPZFMatrix<double> *in_stack_000000c8;
  REAL *in_stack_000000d0;
  TPZFMatrix<double> *in_stack_000000d8;
  TPZFMatrix<double> *in_stack_000000e0;
  TPZVec<double> *in_stack_000000e8;
  TPZGeoEl *in_stack_000000f0;
  TPZCompEl *in_stack_ffffffffffffffd8;
  TPZCompEl *this_00;
  
  *(undefined4 *)(in_RSI + 0x48c4) = 0xffffffff;
  pTVar1 = TPZCompEl::Reference(in_stack_ffffffffffffffd8);
  (**(code **)(*(long *)pTVar1 + 0x210))();
  TPZCompEl::Reference(in_stack_ffffffffffffffd8);
  TPZGeoEl::Jacobian(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                     in_stack_000000d0,in_stack_000000c8);
  (**(code **)(*in_RDI + 0x310))(in_RDI,in_RDX,in_RSI + 0x3900,in_RSI + 0x3a38,in_RSI + 0x3f20);
  if ((*(byte *)(in_RSI + 0x38f8) & 1) != 0) {
    (**(code **)(*in_RDI + 0x300))(in_RDI,in_RSI);
  }
  if ((*(byte *)(in_RSI + 0x38fa) & 1) != 0) {
    dVar2 = (double)(**(code **)(*in_RDI + 0x2d0))();
    *(double *)(in_RSI + 0x4270) = dVar2 * 2.0;
  }
  if ((*(byte *)(in_RSI + 0x38fd) & 1) != 0) {
    (**(code **)(*in_RDI + 0x2c0))(in_RDI,in_RSI);
  }
  this_00 = (TPZCompEl *)0x0;
  TPZManVector<double,_3>::Resize(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  pTVar1 = TPZCompEl::Reference(this_00);
  (**(code **)(*(long *)pTVar1 + 0x228))(pTVar1,in_RDX,in_RSI + 0x41f8);
  return;
}

Assistant:

void TPZReducedSpace::ComputeRequiredData(TPZMaterialDataT<STATE> &data,
                                 TPZVec<REAL> &qsi)
{
    data.intGlobPtIndex = -1;
    int dim = Reference()->Dimension();
    Reference()->Jacobian(qsi, data.jacobian, data.axes, data.detjac, data.jacinv);
    ShapeX(qsi, data.phi, data.dphix, data.axes);

    if (data.fNeedsSol) {
        ReallyComputeSolution(data);
    }
    if (data.fNeedsHSize){
		data.HSize = 2.*this->InnerRadius();
	}//fNeedHSize
    
    if(data.fNeedsNormal){
        this->ComputeNormal(data);
    }
    data.x.Resize(3., 0.);
    Reference()->X(qsi, data.x);
    
}